

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

TValue * luaH_get(Table *t,TValue *key)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  TValue *pTVar4;
  Node *pNVar5;
  luai_Cast u;
  int local_20;
  
  uVar2 = key->tt_ & 0x3f;
  if (uVar2 != 0) {
    if (uVar2 == 3) {
      dVar1 = (key->value_).n;
      local_20 = SUB84(dVar1 + 6755399441055744.0,0);
      if ((dVar1 == (double)local_20) && (!NAN(dVar1) && !NAN((double)local_20))) {
        pTVar4 = luaH_getint(t,local_20);
        return pTVar4;
      }
    }
    else if (uVar2 == 4) {
      pNVar5 = t->node + (uint)(~(-1 << (t->lsizenode & 0x1f)) &
                               (((GCObject *)(key->value_).f)->h).sizearray);
      while (((pNVar5->i_key).nk.tt_ != 0x44 ||
             ((pNVar5->i_key).nk.value_.gc != (GCObject *)(key->value_).f))) {
        pNVar5 = (pNVar5->i_key).nk.next;
        if (pNVar5 == (Node *)0x0) {
          return &luaO_nilobject_;
        }
      }
      return &pNVar5->i_val;
    }
    pNVar5 = mainposition(t,key);
    do {
      if (((pNVar5->i_key).nk.tt_ == key->tt_) &&
         (iVar3 = luaV_equalobj_((lua_State *)0x0,&(pNVar5->i_key).tvk,key), iVar3 != 0)) {
        return &pNVar5->i_val;
      }
      pNVar5 = (pNVar5->i_key).nk.next;
    } while (pNVar5 != (Node *)0x0);
  }
  return &luaO_nilobject_;
}

Assistant:

const TValue *luaH_get (Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TSHRSTR: return luaH_getstr(t, rawtsvalue(key));
    case LUA_TNIL: return luaO_nilobject;
    case LUA_TNUMBER: {
      int k;
      lua_Number n = nvalue(key);
      lua_number2int(k, n);
      if (luai_numeq(cast_num(k), n)) /* index is int? */
        return luaH_getint(t, k);  /* use specialized version */
      /* else go through */
    }
    default: {
      Node *n = mainposition(t, key);
      do {  /* check whether `key' is somewhere in the chain */
        if (luaV_rawequalobj(gkey(n), key))
          return gval(n);  /* that's it */
        else n = gnext(n);
      } while (n);
      return luaO_nilobject;
    }
  }
}